

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::make_exception<const_char_*,_std::fpos<__mbstate_t>_>::operator()
          (make_exception<const_char_*,_std::fpos<__mbstate_t>_> *this,stringstream *msg,char *arg,
          fpos<__mbstate_t> args)

{
  fpos<__mbstate_t> arg_00;
  make_exception<std::fpos<__mbstate_t>_> local_31;
  char *local_30;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_std::fpos<__mbstate_t>_> *this_local;
  fpos<__mbstate_t> args_local;
  
  args_local._M_off = (streamoff)args._M_state;
  this_local = (make_exception<const_char_*,_std::fpos<__mbstate_t>_> *)args._M_off;
  local_30 = arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  std::operator<<((ostream *)(msg + 0x10),arg);
  arg_00._M_state.__count = (undefined4)args_local._M_off;
  arg_00._M_state.__value = (anon_union_4_2_91654ee9_for___value)args_local._M_off._4_4_;
  arg_00._M_off = (streamoff)this_local;
  make_exception<std::fpos<__mbstate_t>_>::operator()(&local_31,(stringstream *)arg_local,arg_00);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }